

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_names * fxp_readdir_recv(sftp_packet *pktin,sftp_request *req)

{
  unsigned_long uVar1;
  void *pvVar2;
  char *pcVar3;
  ptrlen pVar4;
  ulong local_30;
  unsigned_long i;
  fxp_names *ret;
  sftp_request *req_local;
  sftp_packet *pktin_local;
  
  safefree(req);
  if (pktin->type == 0x68) {
    uVar1 = BinarySource_get_uint32(pktin->binarysource_);
    if ((pktin->binarysource_[0].err == BSE_NO_ERROR) &&
       (uVar1 <= (pktin->binarysource_[0].len - pktin->binarysource_[0].pos) / 0xc)) {
      if (uVar1 < 0x1c71c72) {
        pktin_local = (sftp_packet *)safemalloc(1,0x10,0);
        *(int *)&pktin_local->data = (int)uVar1;
        pvVar2 = safemalloc((long)*(int *)&pktin_local->data,0x48,0);
        pktin_local->length = (size_t)pvVar2;
        for (local_30 = 0; local_30 < (ulong)(long)*(int *)&pktin_local->data;
            local_30 = local_30 + 1) {
          pVar4 = BinarySource_get_string(pktin->binarysource_);
          pcVar3 = mkstr(pVar4);
          *(char **)(pktin_local->length + local_30 * 0x48) = pcVar3;
          pVar4 = BinarySource_get_string(pktin->binarysource_);
          pcVar3 = mkstr(pVar4);
          *(char **)(pktin_local->length + local_30 * 0x48 + 8) = pcVar3;
          BinarySource_get_fxp_attrs
                    (pktin->binarysource_,
                     (fxp_attrs *)(pktin_local->length + local_30 * 0x48 + 0x10));
        }
        if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
          sftp_pkt_free(pktin);
        }
        else {
          fxp_internal_error("malformed FXP_NAME packet");
          for (local_30 = 0; local_30 < (ulong)(long)*(int *)&pktin_local->data;
              local_30 = local_30 + 1) {
            safefree(*(void **)(pktin_local->length + local_30 * 0x48));
            safefree(*(void **)(pktin_local->length + local_30 * 0x48 + 8));
          }
          safefree((void *)pktin_local->length);
          safefree(pktin_local);
          safefree(pktin);
          pktin_local = (sftp_packet *)0x0;
        }
      }
      else {
        fxp_internal_error("unreasonably large FXP_NAME packet");
        sftp_pkt_free(pktin);
        pktin_local = (sftp_packet *)0x0;
      }
    }
    else {
      fxp_internal_error("malformed FXP_NAME packet");
      sftp_pkt_free(pktin);
      pktin_local = (sftp_packet *)0x0;
    }
  }
  else {
    fxp_got_status(pktin);
    sftp_pkt_free(pktin);
    pktin_local = (sftp_packet *)0x0;
  }
  return (fxp_names *)pktin_local;
}

Assistant:

struct fxp_names *fxp_readdir_recv(struct sftp_packet *pktin,
                                   struct sftp_request *req)
{
    sfree(req);
    if (pktin->type == SSH_FXP_NAME) {
        struct fxp_names *ret;
        unsigned long i;

        i = get_uint32(pktin);

        /*
         * Sanity-check the number of names. Minimum is obviously
         * zero. Maximum is the remaining space in the packet
         * divided by the very minimum length of a name, which is
         * 12 bytes (4 for an empty filename, 4 for an empty
         * longname, 4 for a set of attribute flags indicating that
         * no other attributes are supplied).
         */
        if (get_err(pktin) || i > get_avail(pktin) / 12) {
            fxp_internal_error("malformed FXP_NAME packet");
            sftp_pkt_free(pktin);
            return NULL;
        }

        /*
         * Ensure the implicit multiplication in the snewn() call
         * doesn't suffer integer overflow and cause us to malloc
         * too little space.
         */
        if (i > INT_MAX / sizeof(struct fxp_name)) {
            fxp_internal_error("unreasonably large FXP_NAME packet");
            sftp_pkt_free(pktin);
            return NULL;
        }

        ret = snew(struct fxp_names);
        ret->nnames = i;
        ret->names = snewn(ret->nnames, struct fxp_name);
        for (i = 0; i < (unsigned long)ret->nnames; i++) {
            ret->names[i].filename = mkstr(get_string(pktin));
            ret->names[i].longname = mkstr(get_string(pktin));
            get_fxp_attrs(pktin, &ret->names[i].attrs);
        }

        if (get_err(pktin)) {
            fxp_internal_error("malformed FXP_NAME packet");
            for (i = 0; i < (unsigned long)ret->nnames; i++) {
                sfree(ret->names[i].filename);
                sfree(ret->names[i].longname);
            }
            sfree(ret->names);
            sfree(ret);
            sfree(pktin);
            return NULL;
        }
        sftp_pkt_free(pktin);
        return ret;
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return NULL;
    }
}